

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall ON_SubDEdge::HasBoundaryEdgeTopology(ON_SubDEdge *this)

{
  ON_SubDFace *this_00;
  ON_SubDEdgePtr OVar1;
  ON_SubDEdgePtr feptr;
  ON_SubDFace *f;
  ON_SubDEdge *this_local;
  
  if ((this->m_face_count == 1) &&
     (this_00 = (ON_SubDFace *)(this->m_face2[0].m_ptr & 0xfffffffffffffff8),
     this_00 != (ON_SubDFace *)0x0)) {
    OVar1 = ON_SubDFace::EdgePtrFromEdge(this_00,this);
    if (this == (ON_SubDEdge *)(OVar1.m_ptr & 0xfffffffffffffff8)) {
      if ((this->m_face2[0].m_ptr & 1) == (OVar1.m_ptr & 1)) {
        if (((this->m_vertex[0] != (ON_SubDVertex *)0x0) &&
            (this->m_vertex[1] != (ON_SubDVertex *)0x0)) && (this->m_vertex[0] != this->m_vertex[1])
           ) {
          return true;
        }
        ON_SubDIncrementErrorCount();
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                   ,0x19ad,"","m_vertex[] has null or invalid pointers.");
      }
      else {
        ON_SubDIncrementErrorCount();
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                   ,0x19a8,"","m_face2[0] has inconsistent direction flags.");
      }
    }
    else {
      ON_SubDIncrementErrorCount();
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                 ,0x19a3,"","m_face2[0] does not reference this edge.");
    }
  }
  return false;
}

Assistant:

bool ON_SubDEdge::HasBoundaryEdgeTopology() const
{
  for (;;)
  {
    if (1 != m_face_count)
      break;
    const ON_SubDFace* f = ON_SUBD_FACE_POINTER(m_face2[0].m_ptr);
    if (nullptr == f)
      break;
    const ON_SubDEdgePtr feptr = f->EdgePtrFromEdge(this);
    if (this != ON_SUBD_EDGE_POINTER(feptr.m_ptr))
    {
      ON_SUBD_ERROR("m_face2[0] does not reference this edge.");
      break;
    }
    if (ON_SUBD_FACE_DIRECTION(m_face2[0].m_ptr) != ON_SUBD_FACE_DIRECTION(feptr.m_ptr))
    {
      ON_SUBD_ERROR("m_face2[0] has inconsistent direction flags.");
      break;
    }
    if (nullptr == m_vertex[0] || nullptr == m_vertex[1] || m_vertex[0] == m_vertex[1])
    {
      ON_SUBD_ERROR("m_vertex[] has null or invalid pointers.");
      break;
    }
    return true;
  }
  return false;
}